

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::texture::anon_unknown_0::FilteringAnisotropyTests::createInstance
          (FilteringAnisotropyTests *this,Context *context)

{
  SamplerType SVar1;
  undefined4 uVar2;
  TestInstance *pTVar3;
  TextureFormat format;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  float fVar4;
  undefined1 local_350 [52];
  Context *local_31c;
  float local_118;
  
  pTVar3 = (TestInstance *)operator_new(0xb8);
  pTVar3->m_context = context;
  pTVar3->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00bdf2e0;
  AnisotropyParams::AnisotropyParams((AnisotropyParams *)(pTVar3 + 1),&this->m_refParams);
  util::createSampler((Sampler *)local_350,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      *(FilterMode *)&pTVar3[10].m_context,
                      *(FilterMode *)((long)&pTVar3[10].m_context + 4));
  *(undefined4 *)((long)&pTVar3[7]._vptr_TestInstance + 4) = local_350._32_4_;
  *(undefined8 *)((long)&pTVar3[6]._vptr_TestInstance + 4) = local_350._16_8_;
  *(undefined8 *)((long)&pTVar3[6].m_context + 4) = local_350._24_8_;
  *(undefined8 *)((long)&pTVar3[5]._vptr_TestInstance + 4) = local_350._0_8_;
  *(undefined8 *)((long)&pTVar3[5].m_context + 4) = local_350._8_8_;
  pTVar3[7].m_context = (Context *)local_350._36_8_;
  pTVar3[8]._vptr_TestInstance = (_func_int **)local_350._44_8_;
  pTVar3[8].m_context = local_31c;
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  SVar1 = glu::TextureTestUtil::getSamplerType(format);
  *(SamplerType *)((long)&pTVar3[1]._vptr_TestInstance + 4) = SVar1;
  *(undefined4 *)&pTVar3[1].m_context = 0;
  *(undefined4 *)&pTVar3[9]._vptr_TestInstance = 0;
  vk = Context::getInstanceInterface(pTVar3->m_context);
  physicalDevice = Context::getPhysicalDevice(pTVar3->m_context);
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_350,vk,physicalDevice);
  fVar4 = *(float *)((long)&pTVar3[10]._vptr_TestInstance + 4);
  if (local_118 <= fVar4) {
    fVar4 = local_118;
  }
  *(float *)((long)&pTVar3[10]._vptr_TestInstance + 4) = fVar4;
  uVar2 = 0;
  if (*(char *)&pTVar3[0xb]._vptr_TestInstance == '\x01') {
    *(undefined8 *)((long)&pTVar3[9]._vptr_TestInstance + 4) = 0x40e0000000000000;
    uVar2 = 7;
  }
  *(undefined4 *)&pTVar3[10]._vptr_TestInstance = uVar2;
  return pTVar3;
}

Assistant:

TestInstance*	createInstance				(Context&	context) const
	{
		return new FilteringAnisotropyInstance(context, m_refParams);
	}